

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError GropeDevice(snd_pcm_t *pcm,int isPlug,StreamDirection mode,int openBlocking,
                   PaAlsaDeviceInfo *devInfo)

{
  snd_pcm_uframes_t sVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  long lVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  snd_pcm_hw_params_t *hwParams;
  PaError PVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uStack_80;
  snd_pcm_hw_params_t asStack_78 [8];
  long local_70;
  long local_68;
  undefined1 local_5c [4];
  int local_58;
  int dir;
  ulong uStack_50;
  uint minChans;
  snd_pcm_uframes_t alsaBufferFrames;
  ulong uStack_40;
  uint maxChans;
  snd_pcm_uframes_t alsaPeriodFrames;
  
  lVar5 = CONCAT44(in_register_0000000c,openBlocking);
  hwParams = asStack_78;
  if (pcm == (snd_pcm_t *)0x0) {
    uStack_80 = 0x10b6e4;
    __assert_fail("pcm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x34f,
                  "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)")
    ;
  }
  alsaPeriodFrames = *(snd_pcm_uframes_t *)(lVar5 + 0x40);
  bVar7 = mode != StreamDirection_In;
  uStack_80 = 0x10b3aa;
  iVar2 = snd_pcm_nonblock();
  if (iVar2 < 0) {
    uStack_80 = 0x10b654;
    GropeDevice_cold_10();
  }
  else {
    uStack_80 = 0x10b3bb;
    local_58 = isPlug;
    __n = snd_pcm_hw_params_sizeof();
    lVar4 = -(__n + 0xf & 0xfffffffffffffff0);
    hwParams = asStack_78 + lVar4;
    *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b3d9;
    memset(hwParams,0,__n);
    *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b3e4;
    snd_pcm_hw_params_any(pcm,hwParams);
    sVar1 = alsaPeriodFrames;
    if ((double)alsaPeriodFrames < 0.0) {
LAB_0010b40b:
      if ((double)alsaPeriodFrames < 0.0) goto LAB_0010b41e;
LAB_0010b48f:
      *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b4a0;
      iVar2 = snd_pcm_hw_params_get_channels_min(hwParams,&dir);
      if (iVar2 < 0) {
        *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b65d;
        GropeDevice_cold_8();
      }
      else {
        *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b4b4;
        iVar2 = snd_pcm_hw_params_get_channels_max(hwParams,(long)&alsaBufferFrames + 4);
        if (iVar2 < 0) {
          *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b666;
          GropeDevice_cold_7();
        }
        else {
          local_68 = (ulong)((uint)bVar7 * 4) + 0x54;
          local_70 = lVar5;
          if ((int)alsaBufferFrames._4_4_ < 0) {
            *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b703;
            __assert_fail("maxChans <= INT_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,899,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if (alsaBufferFrames._4_4_ == 0) {
            *(code **)(asStack_78 + lVar4 + -8) = SetApproximateSampleRate;
            __assert_fail("maxChans > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,900,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if (0x80 < alsaBufferFrames._4_4_ && local_58 != 0) {
            alsaBufferFrames._4_4_ = 0x80;
          }
          uStack_50 = 0x200;
          uStack_40 = 0x80;
          *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b52d;
          iVar2 = snd_pcm_hw_params_set_buffer_size_near(pcm,hwParams);
          if (iVar2 < 0) {
            *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b66f;
            GropeDevice_cold_6();
          }
          else {
            *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b548;
            iVar2 = snd_pcm_hw_params_set_period_size_near
                              (pcm,hwParams,&stack0xffffffffffffffc0,local_5c);
            lVar5 = local_70;
            if (iVar2 < 0) {
              *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b678;
              GropeDevice_cold_5();
            }
            else {
              lVar3 = uStack_50 - uStack_40;
              auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar8._0_8_ = lVar3;
              auVar8._12_4_ = 0x45300000;
              *(double *)(local_70 + (ulong)bVar7 * 8 + 0x20) =
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                   (double)alsaPeriodFrames;
              uStack_50 = 0x800;
              uStack_40 = 0x200;
              *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b5a6;
              iVar2 = snd_pcm_hw_params_any(pcm,hwParams);
              sVar1 = alsaPeriodFrames;
              if (iVar2 < 0) {
                *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b681;
                GropeDevice_cold_4();
              }
              else {
                *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b5be;
                iVar2 = SetApproximateSampleRate(pcm,hwParams,(double)sVar1);
                if (iVar2 < 0) {
                  *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b68a;
                  GropeDevice_cold_3();
                }
                else {
                  *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b5d5;
                  iVar2 = snd_pcm_hw_params_set_buffer_size_near
                                    (pcm,hwParams,&stack0xffffffffffffffb0);
                  if (iVar2 < 0) {
                    *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b693;
                    GropeDevice_cold_2();
                  }
                  else {
                    *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b5f0;
                    iVar2 = snd_pcm_hw_params_set_period_size_near
                                      (pcm,hwParams,&stack0xffffffffffffffc0,local_5c);
                    if (-1 < iVar2) {
                      lVar4 = uStack_50 - uStack_40;
                      auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
                      auVar9._0_8_ = lVar4;
                      auVar9._12_4_ = 0x45300000;
                      *(double *)(lVar5 + ((ulong)bVar7 * 8 | 0x30)) =
                           ((auVar9._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                           (double)alsaPeriodFrames;
                      *(int *)(lVar5 + local_68) = dir;
                      *(uint *)(lVar5 + (ulong)((uint)bVar7 * 4) + 0x14) = alsaBufferFrames._4_4_;
                      *(snd_pcm_uframes_t *)(lVar5 + 0x40) = alsaPeriodFrames;
                      PVar6 = 0;
                      goto LAB_0010b6ab;
                    }
                    *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b69c;
                    GropeDevice_cold_1();
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b3fe;
      iVar2 = SetApproximateSampleRate(pcm,hwParams,(double)sVar1);
      if (-1 < iVar2) goto LAB_0010b40b;
      *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b41e;
      snd_pcm_hw_params_any(pcm,hwParams);
LAB_0010b41e:
      alsaPeriodFrames = CONCAT71(alsaPeriodFrames._1_7_,bVar7);
      dir = 0xac44;
      *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b43b;
      snd_pcm_hw_params_set_rate_resample(pcm,hwParams,0);
      *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b44b;
      iVar2 = snd_pcm_hw_params_set_rate_near(pcm,hwParams,&dir,0);
      if (-1 < iVar2) {
        uStack_40 = CONCAT44(maxChans,1);
        *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b469;
        iVar2 = snd_pcm_hw_params_get_rate_numden(hwParams,&stack0xffffffffffffffb0);
        if (-1 < iVar2) {
          bVar7 = (byte)alsaPeriodFrames;
          alsaPeriodFrames =
               (snd_pcm_uframes_t)
               ((double)(uStack_50 & 0xffffffff) / (double)(uStack_40 & 0xffffffff));
          goto LAB_0010b48f;
        }
        *(undefined8 *)(asStack_78 + lVar4 + -8) = 0x10b6a5;
        GropeDevice_cold_9();
      }
    }
  }
  PVar6 = -9999;
LAB_0010b6ab:
  *(undefined8 *)(hwParams + -8) = 0x10b6b3;
  snd_pcm_close(pcm);
  return PVar6;
}

Assistant:

static PaError GropeDevice( snd_pcm_t* pcm, int isPlug, StreamDirection mode, int openBlocking,
        PaAlsaDeviceInfo* devInfo )
{
    PaError result = paNoError;
    snd_pcm_hw_params_t *hwParams;
    snd_pcm_uframes_t alsaBufferFrames, alsaPeriodFrames;
    unsigned int minChans, maxChans;
    int* minChannels, * maxChannels;
    double * defaultLowLatency, * defaultHighLatency, * defaultSampleRate =
        &devInfo->baseDeviceInfo.defaultSampleRate;
    double defaultSr = *defaultSampleRate;
    int dir;

    assert( pcm );

    PA_DEBUG(( "%s: collecting info ..\n", __FUNCTION__ ));

    if( StreamDirection_In == mode )
    {
        minChannels = &devInfo->minInputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxInputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowInputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighInputLatency;
    }
    else
    {
        minChannels = &devInfo->minOutputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxOutputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowOutputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighOutputLatency;
    }

    ENSURE_( alsa_snd_pcm_nonblock( pcm, 0 ), paUnanticipatedHostError );

    alsa_snd_pcm_hw_params_alloca( &hwParams );
    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( defaultSr >= 0 )
    {
        /* Could be that the device opened in one mode supports samplerates that the other mode wont have,
         * so try again .. */
        if( SetApproximateSampleRate( pcm, hwParams, defaultSr ) < 0 )
        {
            defaultSr = -1.;
            alsa_snd_pcm_hw_params_any( pcm, hwParams ); /* Clear any params (rate) that might have been set */
            PA_DEBUG(( "%s: Original default samplerate failed, trying again ..\n", __FUNCTION__ ));
        }
    }

    if( defaultSr < 0. )           /* Default sample rate not set */
    {
        unsigned int sampleRate = 44100;        /* Will contain approximate rate returned by alsa-lib */

        /* Don't allow rate resampling when probing for the default rate (but ignore if this call fails) */
        alsa_snd_pcm_hw_params_set_rate_resample( pcm, hwParams, 0 );
        if( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &sampleRate, NULL ) < 0 )
        {
            result = paUnanticipatedHostError;
            goto error;
        }
        ENSURE_( GetExactSampleRate( hwParams, &defaultSr ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans ), paUnanticipatedHostError );
    assert( maxChans <= INT_MAX );
    assert( maxChans > 0 );    /* Weird linking issue could cause wrong version of ALSA symbols to be called,
                                   resulting in zeroed values */

    /* XXX: Limit to sensible number (ALSA plugins accept a crazy amount of channels)? */
    if( isPlug && maxChans > 128 )
    {
        maxChans = 128;
        PA_DEBUG(( "%s: Limiting number of plugin channels to %u\n", __FUNCTION__, maxChans ));
    }

    /* TWEAKME:
     * Giving values for default min and max latency is not straightforward.
     *  * for low latency, we want to give the lowest value that will work reliably.
     *      This varies based on the sound card, kernel, CPU, etc.  Better to give
     *      sub-optimal latency than to give a number too low and cause dropouts.
     *  * for high latency we want to give a large enough value that dropouts are basically impossible.
     *      This doesn't really require as much tweaking, since providing too large a number will
     *      just cause us to select the nearest setting that will work at stream config time.
     */
    /* Try low latency values, (sometimes the buffer & period that result are larger) */
    alsaBufferFrames = 512;
    alsaPeriodFrames = 128;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultLowLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    /* Base the high latency case on values four times larger */
    alsaBufferFrames = 2048;
    alsaPeriodFrames = 512;
    /* Have to reset hwParams, to set new buffer size; need to also set sample rate again */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );
    ENSURE_( SetApproximateSampleRate( pcm, hwParams, defaultSr ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultHighLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    *minChannels = (int)minChans;
    *maxChannels = (int)maxChans;
    *defaultSampleRate = defaultSr;

end:
    alsa_snd_pcm_close( pcm );
    return result;

error:
    goto end;
}